

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

Result<wasm::Type> * __thiscall
wasm::IRBuilder::getLabelType
          (Result<wasm::Type> *__return_storage_ptr__,IRBuilder *this,Index label)

{
  undefined8 *puVar1;
  Type TVar2;
  undefined1 local_88 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> scope;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> _val;
  
  getScope((Result<wasm::IRBuilder::ScopeCtx_*> *)local_88,this,label);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_40,
                  (_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_88);
  if (_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._24_1_ == '\x01') {
    scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_ = &local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20),
               local_40,(long)_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              _M_u._M_first._M_storage + (long)local_40);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = puVar1;
    if ((undefined8 *)
        scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_ == &local_50) {
      *puVar1 = local_50;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x18) = uStack_48;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err> =
           scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
           super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10) = local_50;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err> + 8) = local_58;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_40);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_40);
    if ((*(__index_type *)((long)local_88 + 0x18) == '\x05') && (*(long *)local_88 != 0)) {
      TVar2.id = ((Type *)((long)local_88 + 0x48))->id;
    }
    else {
      TVar2 = ScopeCtx::getResultType((ScopeCtx *)local_88);
    }
    *(uintptr_t *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = TVar2.id;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Result<Type> IRBuilder::getLabelType(Index label) {
  auto scope = getScope(label);
  CHECK_ERR(scope);
  return (*scope)->getLabelType();
}